

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateReplayer::Impl::parse_attachment_description_stencil_layout
          (Impl *this,Value *state,VkAttachmentDescriptionStencilLayout **out_info)

{
  VkAttachmentDescriptionStencilLayout *pVVar1;
  Type pGVar2;
  
  pVVar1 = (VkAttachmentDescriptionStencilLayout *)
           ScratchAllocator::allocate_raw(&this->allocator,0x18,0x10);
  if (pVVar1 != (VkAttachmentDescriptionStencilLayout *)0x0) {
    *(undefined8 *)pVVar1 = 0;
    pVVar1->pNext = (void *)0x0;
    pVVar1->stencilInitialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
    pVVar1->stencilFinalLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  }
  *out_info = pVVar1;
  pGVar2 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"stencilInitialLayout");
  if ((undefined1  [16])((undefined1  [16])pGVar2->data_ & (undefined1  [16])0x40000000000000) !=
      (undefined1  [16])0x0) {
    pVVar1->stencilInitialLayout = (pGVar2->data_).s.length;
    pGVar2 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)state,"stencilFinalLayout");
    if ((undefined1  [16])((undefined1  [16])pGVar2->data_ & (undefined1  [16])0x40000000000000) !=
        (undefined1  [16])0x0) {
      pVVar1->stencilFinalLayout = (pGVar2->data_).s.length;
      return true;
    }
  }
  __assert_fail("data_.f.flags & kUintFlag",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                ,0x719,
                "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

bool StateReplayer::Impl::parse_attachment_description_stencil_layout(const Value &state,
                                                                      VkAttachmentDescriptionStencilLayout **out_info)
{
	auto *info = allocator.allocate_cleared<VkAttachmentDescriptionStencilLayout>();
	*out_info = info;

	info->stencilInitialLayout = static_cast<VkImageLayout>(state["stencilInitialLayout"].GetUint());
	info->stencilFinalLayout = static_cast<VkImageLayout>(state["stencilFinalLayout"].GetUint());
	return true;
}